

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O1

void test_5(void)

{
  element_type *peVar1;
  ChStreamOutAscii *pCVar2;
  ChBody *__p;
  element_type **size;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  double local_a20;
  double local_a18;
  double local_a10;
  ChVector<double> v;
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChElementHexaCorot_20> melement1;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode16;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode15;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode14;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode13;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode20;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode19;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode18;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode17;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode12;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode11;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode10;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode9;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint4;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  element_type *local_828;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_820;
  element_type *local_818;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_810;
  element_type *local_808;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_800;
  element_type *local_7f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7f0;
  element_type *local_7e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7e0;
  element_type *local_7d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7d0;
  element_type *local_7c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7c0;
  element_type *local_7b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7b0;
  element_type *local_7a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_7a0;
  element_type *local_798;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_790;
  element_type *local_788;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_780;
  element_type *local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_770;
  element_type *local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_760;
  element_type *local_758;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_750;
  element_type *local_748;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_740;
  element_type *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_730;
  element_type *local_728;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_720;
  element_type *local_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_710;
  element_type *local_708;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_700;
  element_type *local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6f0;
  element_type *local_6e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6e0;
  element_type *local_6d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6d0;
  element_type *local_6c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6c0;
  element_type *local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6b0;
  element_type *local_6a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6a0;
  element_type *local_698;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_690;
  element_type *local_688;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_680;
  element_type *local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_670;
  element_type *local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_660;
  element_type *local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_650;
  element_type *local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_640;
  element_type *local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_630;
  element_type *local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_620;
  element_type *local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_610;
  element_type *local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_600;
  element_type *local_5f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5f0;
  element_type *local_5e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5e0;
  element_type *local_5d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5d0;
  element_type *local_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5c0;
  element_type *local_5b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5b0;
  element_type *local_5a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5a0;
  element_type *local_598;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_590;
  element_type *local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_580;
  element_type *local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_570;
  element_type *local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  element_type *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_550;
  element_type *local_548;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_540;
  element_type *local_538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_530;
  element_type *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_520;
  element_type *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_510;
  element_type *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_500;
  element_type *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4f0;
  element_type *local_4e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4e0;
  element_type *local_4d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4d0;
  element_type *local_4c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4c0;
  element_type *local_4b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4b0;
  element_type *local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  ChSystemSMC sys;
  long *local_38;
  
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar2,"\n-------------------------------------------------\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar2,"TEST: QUADRATIC hexahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC(&sys,true);
  my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChMesh,std::allocator<chrono::fea::ChMesh>>
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChMesh **)&my_mesh,(allocator<chrono::fea::ChMesh> *)&v);
  mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChContinuumElastic,std::allocator<chrono::fea::ChContinuumElastic>>
            (&mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChContinuumElastic **)&mmaterial,
             (allocator<chrono::fea::ChContinuumElastic> *)&v);
  chrono::fea::ChContinuumElastic::Set_E(207000000.0);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  v.m_data[2] = 0.0;
  v.m_data[0] = 0.0;
  v.m_data[1] = 0.0;
  mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode1,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.0;
  v.m_data[1] = 0.0;
  v.m_data[2] = 0.01;
  mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode2,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.0;
  v.m_data[2] = 0.01;
  mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode3,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.0;
  v.m_data[2] = 0.0;
  mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode4,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.0;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.0;
  mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode5,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.0;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.01;
  mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode6,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.01;
  mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode7,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.0;
  mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode8,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode9,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode10,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode11,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode12,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode13,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode14,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode15,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode16,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode17,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode18,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode19,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  v.m_data[0] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x20) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20)) * 0.5;
  v.m_data[1] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x28) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28)) * 0.5;
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyz **)&mnode20,
             (allocator<chrono::fea::ChNodeFEAxyz> *)&local_a20,&v);
  local_3f0 = 0;
  local_3e8 = 0xc07f400000000000;
  local_3e0 = 0;
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_408 = 0;
  local_400 = 0xc07f400000000000;
  local_3f8 = 0;
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_420 = 0;
  local_418 = 0xc07f400000000000;
  local_410 = 0;
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_438 = 0;
  local_430 = 0xc07f400000000000;
  local_428 = 0;
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_450 = 0;
  local_448 = 0xc07f400000000000;
  local_440 = 0;
  (**(code **)(*(long *)mnode13.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_468 = 0;
  local_460 = 0xc07f400000000000;
  local_458 = 0;
  (**(code **)(*(long *)mnode14.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_480 = 0;
  local_478 = 0xc07f400000000000;
  local_470 = 0;
  (**(code **)(*(long *)mnode15.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_498 = 0;
  local_490 = 0xc07f400000000000;
  local_488 = 0;
  (**(code **)(*(long *)mnode16.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_4b8 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_4b0 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_4b8);
  if (local_4b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b0);
  }
  local_4c8 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_4c0 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_4c8);
  if (local_4c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c0);
  }
  local_4d8 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_4d0 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_4d8);
  if (local_4d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0);
  }
  local_4e8 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_4e0 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_4e8);
  if (local_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0);
  }
  local_4f8 = mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_4f0 = mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_4f8);
  if (local_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0);
  }
  local_508 = mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_500 = mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_508);
  if (local_500 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_500);
  }
  local_518 = mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_510 = mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_518);
  if (local_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_510);
  }
  local_528 = mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_520 = mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_528);
  if (local_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520);
  }
  local_538 = mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_530 = mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_538);
  if (local_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530);
  }
  local_548 = mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_540 = mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_548);
  if (local_540 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540);
  }
  local_558 = mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_550 = mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_558);
  if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550);
  }
  local_568 = mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_560 = mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_568);
  if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560);
  }
  local_578 = mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_570 = mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_578);
  if (local_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570);
  }
  local_588 = mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_580 = mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_588);
  if (local_580 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580);
  }
  local_598 = mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_590 = mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_598);
  if (local_590 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_590);
  }
  local_5a8 = mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5a0 = mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5a8);
  if (local_5a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5a0);
  }
  local_5b8 = mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5b0 = mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5b8);
  if (local_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5b0);
  }
  local_5c8 = mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5c0 = mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5c8);
  if (local_5c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5c0);
  }
  local_5d8 = mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5d0 = mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5d8);
  if (local_5d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d0);
  }
  local_5e8 = mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5e0 = mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_5e8);
  if (local_5e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e0);
  }
  melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChElementHexaCorot_20,std::allocator<chrono::fea::ChElementHexaCorot_20>>
            (&melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChElementHexaCorot_20 **)&melement1,
             (allocator<chrono::fea::ChElementHexaCorot_20> *)&v);
  local_5f8 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_5f0 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_608 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_600 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_618 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_610 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_628 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_620 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_638 = mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_630 = mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_648 = mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_640 = mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_658 = mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_650 = mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_668 = mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_660 = mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_678 = mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_670 = mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_688 = mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_680 = mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_698 = mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_690 = mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6a8 = mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6a0 = mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6b8 = mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6b0 = mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6c8 = mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6c0 = mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6d8 = mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6d0 = mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6e8 = mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6e0 = mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_6f8 = mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_6f0 = mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_708 = mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_700 = mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_718 = mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_710 = mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_728 = mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_720 = mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)melement1.
                        super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x38))
            (melement1.
             super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&local_5f8,&local_608,&local_618,&local_628,&local_638,&local_648,&local_658,
             &local_668,&local_678,&local_688,&local_698,&local_6a8,&local_6b8,&local_6c8,&local_6d8
             ,&local_6e8,&local_6f8,&local_708,&local_718,&local_728);
  if (local_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_720);
  }
  if (local_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_710);
  }
  if (local_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_700);
  }
  if (local_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6f0);
  }
  if (local_6e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6e0);
  }
  if (local_6d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6d0);
  }
  if (local_6c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c0);
  }
  if (local_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b0);
  }
  if (local_6a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6a0);
  }
  if (local_690 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_690);
  }
  if (local_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_680);
  }
  if (local_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_670);
  }
  if (local_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660);
  }
  if (local_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650);
  }
  if (local_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640);
  }
  if (local_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630);
  }
  if (local_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_620);
  }
  if (local_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_610);
  }
  if (local_600 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600);
  }
  if (local_5f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0);
  }
  local_4a8 = mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_4a0._M_pi =
       mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (mmaterial.
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (mmaterial.
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  *(element_type **)
   (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr + 0xb8) =
       mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 0xc0),&local_4a0);
  if (local_4a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0._M_pi);
  }
  (**(code **)(*(long *)melement1.
                        super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x48))();
  local_738 = melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 8;
  if (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_738 = (element_type *)0x0;
  }
  local_730 = melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (melement1.
            super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (melement1.
            super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddElement
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_738);
  if (local_730 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_730);
  }
  local_748 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_740 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  size = &local_748;
  chrono::ChSystem::Add(&sys);
  if (local_740 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_740);
  }
  __p = (ChBody *)chrono::ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)size);
  chrono::ChBody::ChBody(__p,0);
  truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            (&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p);
  local_758 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_750 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(&sys,&local_758);
  if (local_750 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_750);
  }
  chrono::ChBody::SetBodyFixed
            (SUB81(truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChLinkPointFrame **)&constraint1,
             (allocator<chrono::fea::ChLinkPointFrame> *)&v);
  constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChLinkPointFrame **)&constraint2,
             (allocator<chrono::fea::ChLinkPointFrame> *)&v);
  constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChLinkPointFrame **)&constraint3,
             (allocator<chrono::fea::ChLinkPointFrame> *)&v);
  constraint4.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChLinkPointFrame **)&constraint4,
             (allocator<chrono::fea::ChLinkPointFrame> *)&v);
  local_768 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_760 = mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_778 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_778 = (element_type *)0x0;
  }
  local_770 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)constraint1.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint1.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_768,&local_778,0);
  if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_770);
  }
  if (local_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_760);
  }
  local_788 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_780 = mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_798 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_798 = (element_type *)0x0;
  }
  local_790 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)constraint2.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint2.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_788,&local_798,0);
  if (local_790 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_790);
  }
  if (local_780 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_780);
  }
  local_7a8 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_7a0 = mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_7b8 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_7b8 = (element_type *)0x0;
  }
  local_7b0 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)constraint3.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint3.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_7a8,&local_7b8,0);
  if (local_7b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b0);
  }
  if (local_7a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7a0);
  }
  local_7c8 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_7c0 = mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_7d8 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_7d8 = (element_type *)0x0;
  }
  local_7d0 = truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)constraint4.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint4.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_7c8,&local_7d8,0);
  if (local_7d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7d0);
  }
  if (local_7c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c0);
  }
  local_7e8 = constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_7e0 = constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint1.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint1.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(&sys,&local_7e8);
  if (local_7e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7e0);
  }
  local_7f8 = constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_7f0 = constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint2.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint2.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(&sys,&local_7f8);
  if (local_7f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7f0);
  }
  local_808 = constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_800 = constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint3.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint3.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(&sys,&local_808);
  if (local_800 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_800);
  }
  local_818 = constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_810 = constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (constraint4.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (constraint4.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint4.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (constraint4.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (constraint4.
            super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(&sys,&local_818);
  if (local_810 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_810);
  }
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSolverMINRES,std::allocator<chrono::ChSolverMINRES>>
            (&solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChSolverMINRES **)&solver,(allocator<chrono::ChSolverMINRES> *)&v);
  local_828 = solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              0x18;
  if (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_828 = (element_type *)0x0;
  }
  local_820 = solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::SetSolver(&sys,&local_828);
  if (local_820 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_820);
  }
  *(undefined4 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xc) =
       100;
  *(undefined8 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) =
       0x3d719799812dea11;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] =
       (element_type)0x1;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] =
       (element_type)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node5 displ: ");
  peVar1 = mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (&local_a20,
             mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data[0] = *(double *)(peVar1 + 0x20) - local_a20;
  v.m_data[1] = *(double *)(peVar1 + 0x28) - local_a18;
  v.m_data[2] = *(double *)(peVar1 + 0x30) - local_a10;
  pCVar2 = chrono::operator<<(pCVar2,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node6 displ: ");
  peVar1 = mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (&local_a20,
             mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data[0] = *(double *)(peVar1 + 0x20) - local_a20;
  v.m_data[1] = *(double *)(peVar1 + 0x28) - local_a18;
  v.m_data[2] = *(double *)(peVar1 + 0x30) - local_a10;
  pCVar2 = chrono::operator<<(pCVar2,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node7 displ: ");
  peVar1 = mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (&local_a20,
             mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data[0] = *(double *)(peVar1 + 0x20) - local_a20;
  v.m_data[1] = *(double *)(peVar1 + 0x28) - local_a18;
  v.m_data[2] = *(double *)(peVar1 + 0x30) - local_a10;
  pCVar2 = chrono::operator<<(pCVar2,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"node8 displ: ");
  peVar1 = mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (&local_a20,
             mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data[0] = *(double *)(peVar1 + 0x20) - local_a20;
  v.m_data[1] = *(double *)(peVar1 + 0x28) - local_a18;
  v.m_data[2] = *(double *)(peVar1 + 0x30) - local_a10;
  pCVar2 = chrono::operator<<(pCVar2,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  pCVar2 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"Element volume");
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar2,*(double *)
                              (melement1.
                               super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x100));
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
  if (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (constraint4.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (constraint4.
               super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (constraint3.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (constraint3.
               super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (constraint2.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (constraint2.
               super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (constraint1.super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (constraint1.
               super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (melement1.super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (melement1.
               super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (mmaterial.super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mmaterial.
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _sys = chrono::ChSystemSMC::ChSystemSMC;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  chrono::ChSystem::~ChSystem((ChSystem *)&sys);
  return;
}

Assistant:

void test_5() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: QUADRATIC hexahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e6);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    double sx = 0.01;
    double sy = 0.1;
    double sz = 0.01;
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, sz));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, sz));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, 0));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, 0));
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, sz));
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, sz));
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, 0));
    auto mnode9 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode2->pos) * 0.5);  // in between front face
    auto mnode10 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode3->pos) * 0.5);
    auto mnode11 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode4->pos) * 0.5);
    auto mnode12 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode4->pos) * 0.5);
    auto mnode13 = chrono_types::make_shared<ChNodeFEAxyz>((mnode5->pos + mnode6->pos) * 0.5);  // in between back face
    auto mnode14 = chrono_types::make_shared<ChNodeFEAxyz>((mnode6->pos + mnode7->pos) * 0.5);
    auto mnode15 = chrono_types::make_shared<ChNodeFEAxyz>((mnode7->pos + mnode8->pos) * 0.5);
    auto mnode16 = chrono_types::make_shared<ChNodeFEAxyz>((mnode8->pos + mnode5->pos) * 0.5);
    auto mnode17 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode6->pos) * 0.5);  // in between side edges
    auto mnode18 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode7->pos) * 0.5);
    auto mnode19 = chrono_types::make_shared<ChNodeFEAxyz>((mnode4->pos + mnode8->pos) * 0.5);
    auto mnode20 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode5->pos) * 0.5);

    // For example, set applied forces to nodes:
    mnode5->SetForce(ChVector<>(0, -500, 0));
    mnode6->SetForce(ChVector<>(0, -500, 0));
    mnode7->SetForce(ChVector<>(0, -500, 0));
    mnode8->SetForce(ChVector<>(0, -500, 0));
    mnode13->SetForce(ChVector<>(0, -500, 0));
    mnode14->SetForce(ChVector<>(0, -500, 0));
    mnode15->SetForce(ChVector<>(0, -500, 0));
    mnode16->SetForce(ChVector<>(0, -500, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);
    my_mesh->AddNode(mnode9);
    my_mesh->AddNode(mnode10);
    my_mesh->AddNode(mnode11);
    my_mesh->AddNode(mnode12);
    my_mesh->AddNode(mnode13);
    my_mesh->AddNode(mnode14);
    my_mesh->AddNode(mnode15);
    my_mesh->AddNode(mnode16);
    my_mesh->AddNode(mnode17);
    my_mesh->AddNode(mnode18);
    my_mesh->AddNode(mnode19);
    my_mesh->AddNode(mnode20);

    // Create the tetrahedron element, and assign
    // its nodes and material
    auto melement1 = chrono_types::make_shared<ChElementHexaCorot_20>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8, mnode9, mnode10, mnode11,
                        mnode12, mnode13, mnode14, mnode15, mnode16, mnode17, mnode18, mnode19, mnode20);
    melement1->SetMaterial(mmaterial);

    // Use this statement to use the reduced integration
    // Default number of gauss point: 27. Reduced integration -> 8 Gp.
    melement1->SetReducedIntegrationRule();

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint4 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,   // node
                            truss);   // body to be connected to

    constraint3->Initialize(mnode3,   // node
                            truss);   // body to be connected to

    constraint4->Initialize(mnode4,   // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);
    sys.Add(constraint4);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output some results
    GetLog() << "node5 displ: " << mnode5->GetPos() - mnode5->GetX0() << "\n";
    GetLog() << "node6 displ: " << mnode6->GetPos() - mnode6->GetX0() << "\n";
    GetLog() << "node7 displ: " << mnode7->GetPos() - mnode7->GetX0() << "\n";
    GetLog() << "node8 displ: " << mnode8->GetPos() - mnode8->GetX0() << "\n";
    GetLog() << "Element volume" << melement1->GetVolume() << "\n";
}